

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

String * __thiscall
String::substr(String *__return_storage_ptr__,String *this,ssize start,ssize length)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->data->len;
  if (start < 0) {
    uVar3 = 0;
    if (0 < (long)(uVar2 + start)) {
      uVar3 = uVar2 + start;
    }
  }
  else {
    uVar3 = start;
    if (uVar2 < (ulong)start) {
      uVar3 = uVar2;
    }
  }
  if (length < 0) {
    uVar2 = this->data->len;
  }
  else {
    uVar1 = this->data->len;
    uVar2 = length + uVar3;
    if (uVar1 <= length + uVar3) {
      uVar2 = uVar1;
    }
  }
  String(__return_storage_ptr__,this->data->str + uVar3,uVar2 - uVar3);
  return __return_storage_ptr__;
}

Assistant:

String substr(ssize start, ssize length = -1) const
  {
    if(start < 0)
    {
      start = (ssize)data->len + start;
      if(start < 0)
        start = 0;
    }
    else if((usize)start > data->len)
      start = data->len;

    usize end;
    if(length >= 0)
    {
      end = (usize)start + (usize)length;
      if(end > data->len)
        end = data->len;
    }
    else
      end = data->len;

    length = end - start;
    return String(data->str + start, length);
  }